

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd.hh
# Opt level: O0

void tchecker::ts::next<tchecker::ta::ta_t>
               (ta_t *fwd_impl,const_state_t *s,
               vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
               *v,state_status_t mask)

{
  bool bVar1;
  outgoing_edges_iterator_t *poVar2;
  sync_edges_t local_2d8;
  outgoing_edges_value_t *local_290;
  outgoing_edges_value_t *out_edge;
  end_iterator_t __end0;
  undefined1 local_278 [8];
  outgoing_edges_iterator_t __begin0;
  outgoing_edges_range_t *__range2;
  outgoing_edges_range_t out_edges;
  state_status_t mask_local;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *v_local;
  const_state_t *s_local;
  ta_t *fwd_impl_local;
  
  out_edges._292_4_ = mask;
  ta::ta_t::outgoing_edges((outgoing_edges_range_t *)&__range2,fwd_impl,s);
  __begin0._280_8_ = (outgoing_edges_range_t *)&__range2;
  poVar2 = range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t>::begin
                     ((outgoing_edges_range_t *)&__range2);
  syncprod::outgoing_edges_iterator_t::outgoing_edges_iterator_t
            ((outgoing_edges_iterator_t *)local_278,poVar2);
  range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t>::end
            ((range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t> *)
             __begin0._280_8_);
  while( true ) {
    bVar1 = syncprod::outgoing_edges_iterator_t::operator!=
                      ((outgoing_edges_iterator_t *)local_278,
                       (end_iterator_t *)((long)&out_edge + 3));
    if (!bVar1) break;
    syncprod::outgoing_edges_iterator_t::operator*
              (&local_2d8,(outgoing_edges_iterator_t *)local_278);
    local_290 = &local_2d8;
    ta::ta_t::next(fwd_impl,s,local_290,v,out_edges._292_4_);
    syncprod::vloc_edges_iterator_t::sync_edges_t::~sync_edges_t(&local_2d8);
    syncprod::outgoing_edges_iterator_t::operator++((outgoing_edges_iterator_t *)local_278);
  }
  syncprod::outgoing_edges_iterator_t::~outgoing_edges_iterator_t
            ((outgoing_edges_iterator_t *)local_278);
  range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t>::~range_t
            ((range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t> *)
             &__range2);
  return;
}

Assistant:

void next(FWD_IMPL & fwd_impl, typename FWD_IMPL::const_state_t const & s, std::vector<typename FWD_IMPL::sst_t> & v,
          tchecker::state_status_t mask)
{
  typename FWD_IMPL::outgoing_edges_range_t out_edges = fwd_impl.outgoing_edges(s);
  for (typename FWD_IMPL::outgoing_edges_value_t && out_edge : out_edges)
    fwd_impl.next(s, out_edge, v, mask);
}